

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::Compilation::getGlobalClockingAndNoteUse(Compilation *this,Scope *scope)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  long lVar9;
  HierarchicalReference *ref;
  Scope *pSVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  undefined1 auVar19 [16];
  Symbol *local_38;
  
  sVar14 = 0;
  pSVar10 = scope;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = pSVar10;
    uVar11 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar8 = uVar11 >> ((byte)(this->globalClockingMap).table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
                             .arrays.groups_size_index & 0x3f);
    pgVar3 = (this->globalClockingMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
             .arrays.groups_;
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar11 & 0xff];
    ppVar4 = (this->globalClockingMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
             .arrays.elements_;
    uVar5 = (this->globalClockingMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
            .arrays.groups_size_mask;
    uVar13 = 0;
    do {
      pgVar1 = pgVar3 + uVar8;
      uVar15 = (uchar)uVar2;
      auVar19[0] = -(pgVar1->m[0].n == uVar15);
      uVar16 = (uchar)((uint)uVar2 >> 8);
      auVar19[1] = -(pgVar1->m[1].n == uVar16);
      uVar17 = (uchar)((uint)uVar2 >> 0x10);
      auVar19[2] = -(pgVar1->m[2].n == uVar17);
      uVar18 = (uchar)((uint)uVar2 >> 0x18);
      auVar19[3] = -(pgVar1->m[3].n == uVar18);
      auVar19[4] = -(pgVar1->m[4].n == uVar15);
      auVar19[5] = -(pgVar1->m[5].n == uVar16);
      auVar19[6] = -(pgVar1->m[6].n == uVar17);
      auVar19[7] = -(pgVar1->m[7].n == uVar18);
      auVar19[8] = -(pgVar1->m[8].n == uVar15);
      auVar19[9] = -(pgVar1->m[9].n == uVar16);
      auVar19[10] = -(pgVar1->m[10].n == uVar17);
      auVar19[0xb] = -(pgVar1->m[0xb].n == uVar18);
      auVar19[0xc] = -(pgVar1->m[0xc].n == uVar15);
      auVar19[0xd] = -(pgVar1->m[0xd].n == uVar16);
      auVar19[0xe] = -(pgVar1->m[0xe].n == uVar17);
      auVar19[0xf] = -(pgVar1->m[0xf].n == uVar18);
      for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
          uVar12 = uVar12 - 1 & uVar12) {
        iVar6 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        if (pSVar10 == *(Scope **)((long)&ppVar4[uVar8 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
          lVar9 = (long)&ppVar4[uVar8 * 0xf].first + (ulong)(uint)(iVar6 << 4);
          goto LAB_0015564d;
        }
      }
      if ((pgVar3[uVar8].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7]) == 0) break;
      lVar9 = uVar8 + uVar13;
      uVar13 = uVar13 + 1;
      uVar8 = lVar9 + 1U & uVar5;
    } while (uVar13 <= uVar5);
    lVar9 = 0;
LAB_0015564d:
    if ((lVar9 != 0) && (local_38 = *(Symbol **)(lVar9 + 8), sVar14 != 0)) {
      ref = BumpAllocator::emplace<slang::ast::HierarchicalReference>(&this->super_BumpAllocator);
      ref->target = local_38;
      ref->upwardCount = sVar14;
      noteUpwardReference(this,scope,ref);
    }
    if (lVar9 != 0) {
      return local_38;
    }
    pSVar10 = Symbol::getHierarchicalParent(pSVar10->thisSym);
    sVar14 = sVar14 + 1;
    if (pSVar10 == (Scope *)0x0) {
      return (Symbol *)0x0;
    }
  } while( true );
}

Assistant:

const Symbol* Compilation::getGlobalClockingAndNoteUse(const Scope& scope) {
    SLANG_ASSERT(!isFrozen());

    size_t upwardCount = 0;
    auto curr = &scope;
    do {
        if (auto it = globalClockingMap.find(curr); it != globalClockingMap.end()) {
            auto found = it->second;
            if (upwardCount > 0) {
                auto ref = emplace<HierarchicalReference>();
                ref->target = found;
                ref->upwardCount = upwardCount;
                noteUpwardReference(scope, *ref);
            }

            return found;
        }

        curr = curr->asSymbol().getHierarchicalParent();
        upwardCount++;
    } while (curr);

    return nullptr;
}